

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_draw.cpp
# Opt level: O3

void anon_unknown.dwarf_86b0e::materialize_gate
               (ComponentWidget *widget,float min_width,float min_height)

{
  ModelComponent *this;
  float height;
  pin_id_t pVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  Point local_60;
  Point local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  this = widget->m_component;
  fVar3 = ceilf((float)(this->m_controls + 1) * 0.5);
  fVar3 = fVar3 * 10.0;
  if (fVar3 <= 60.0) {
    fVar3 = 60.0;
  }
  uVar2 = this->m_outputs;
  if (this->m_outputs < this->m_inputs) {
    uVar2 = this->m_inputs;
  }
  fVar4 = ceilf((float)(uVar2 + 1) * 0.5);
  height = fVar4 * 20.0;
  if (fVar4 * 20.0 <= min_width) {
    height = min_width;
  }
  lsim::gui::ComponentWidget::change_size(widget,fVar3,height);
  if (this->m_inputs != 0) {
    pVar1 = lsim::ModelComponent::input_pin_id(this,0);
    uVar2 = this->m_inputs;
    lsim::Point::Point(&local_38,-(fVar3 * 0.5),0.0);
    lsim::Point::Point(&local_40,0.0,1.0);
    lsim::gui::ComponentWidget::add_pin_line(widget,pVar1,(ulong)uVar2,height,local_38,local_40);
  }
  if (this->m_outputs != 0) {
    pVar1 = lsim::ModelComponent::output_pin_id(this,0);
    uVar2 = this->m_outputs;
    lsim::Point::Point(&local_48,fVar3 * 0.5,0.0);
    lsim::Point::Point(&local_50,0.0,1.0);
    lsim::gui::ComponentWidget::add_pin_line(widget,pVar1,(ulong)uVar2,height,local_48,local_50);
  }
  if (this->m_controls != 0) {
    pVar1 = lsim::ModelComponent::control_pin_id(this,0);
    uVar2 = this->m_controls;
    lsim::Point::Point(&local_58,0.0,height * -0.5);
    lsim::Point::Point(&local_60,1.0,0.0);
    lsim::gui::ComponentWidget::add_pin_line(widget,pVar1,(ulong)uVar2,fVar3,local_58,local_60);
  }
  return;
}

Assistant:

void materialize_gate(ComponentWidget *widget, float min_width = 60, float min_height = 60) {

	auto model = widget->component_model();

	// size of component box depends on pin count
	const float width = std::max(min_width, 10.0f * std::ceil((model->num_controls() + 1) / 2.0f));
	const float height = std::max(min_height, 20.0f * (std::ceil((std::max(model->num_inputs(), model->num_outputs()) + 1) / 2.0f)));
	const float h_width = width / 2.0f;
	const float h_height = height / 2.0f;

	widget->change_size(width, height);

	// pins
	if (model->num_inputs() > 0) {
		widget->add_pin_line(model->input_pin_id(0), model->num_inputs(),
			height, { -h_width, 0 }, { 0, 1 });
	}
	if (model->num_outputs() > 0) {
		widget->add_pin_line(model->output_pin_id(0), model->num_outputs(),
			height, { h_width, 0 }, { 0, 1 });
	}
	if (model->num_controls() > 0) {
		widget->add_pin_line(model->control_pin_id(0), model->num_controls(),
			width, { 0, -h_height }, { 1, 0 });
	}
}